

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generalizers.cpp
# Opt level: O0

void am_valgen_ok_proc(Am_Object *cmd)

{
  Am_Slot_Key key;
  bool bVar1;
  int iVar2;
  Am_Value *pAVar3;
  ostream *poVar4;
  void *pvVar5;
  Am_Wrapper *pAVar6;
  byte local_40a;
  Am_Object local_3a0;
  undefined1 local_398 [8];
  Am_Value new_value;
  Am_Object local_380;
  Am_Object new_ph;
  ostrstream local_370 [8];
  ostrstream oss;
  char local_208 [8];
  char line [250];
  Am_Object local_100;
  Am_Object local_f8;
  int local_ec;
  undefined1 local_e8 [4];
  int placeholder_cnt;
  Am_Value_List placeholder_list;
  Am_Value old_val;
  Am_Object local_c0;
  Am_Object local_b8;
  Am_Object create_cmd;
  Am_Object script_line;
  Am_Object proto;
  Am_Value_List part_chain;
  Am_Object local_78;
  undefined1 local_69;
  bool modify_first_only;
  int local_5c;
  int how_gen;
  Am_Object execute_command;
  undefined1 local_48 [6];
  Am_Slot_Key slot;
  Am_Value_List sel_list;
  Am_Object script_window;
  Am_Object local_20;
  Am_Object local_18;
  Am_Object valgen_window;
  Am_Object *cmd_local;
  
  valgen_window.data = (Am_Object_Data *)cmd;
  Am_Object::Get_Object(&local_20,(Am_Slot_Key)cmd,0x170);
  Am_Object::Get_Owner(&local_18,(Am_Slot_Flags)&local_20);
  Am_Object::~Am_Object(&local_20);
  pAVar3 = Am_Object::Get(&local_18,Am_SCRIPT_WINDOW,0);
  Am_Object::Am_Object((Am_Object *)&sel_list.item,pAVar3);
  pAVar3 = Am_Object::Get(&local_18,0xc5,0);
  Am_Value_List::Am_Value_List((Am_Value_List *)local_48,pAVar3);
  pAVar3 = Am_Object::Get(&local_18,0xb8,0);
  iVar2 = Am_Value::operator_cast_to_int(pAVar3);
  execute_command.data._6_2_ = (Am_Slot_Key)iVar2;
  pAVar3 = Am_Object::Get((Am_Object *)&sel_list.item,Am_SCRIPT_EXECUTE_COMMAND,0);
  Am_Object::Am_Object((Am_Object *)&stack0xffffffffffffffa8,pAVar3);
  Am_Object::Get_Object
            ((Am_Object *)&stack0xffffffffffffff98,(Am_Slot_Key)&local_18,(ulong)Am_UNDO_OPTIONS);
  pAVar3 = Am_Object::Get((Am_Object *)&stack0xffffffffffffff98,0x169,0);
  iVar2 = Am_Value::operator_cast_to_int(pAVar3);
  Am_Object::~Am_Object((Am_Object *)&stack0xffffffffffffff98);
  local_5c = iVar2;
  Am_Object::Get_Object(&local_78,(Am_Slot_Key)&local_18,(ulong)Am_GREEN_AND_YELLOW);
  pAVar3 = Am_Object::Get(&local_78,0x169,0);
  iVar2 = Am_Value::operator_cast_to_int(pAVar3);
  Am_Object::~Am_Object(&local_78);
  local_69 = iVar2 == 1;
  sort_sel_list_cmd_order
            ((Am_Value_List *)&part_chain.item,(Am_Object *)local_48,
             SUB81(&stack0xffffffffffffffa8,0));
  Am_Value_List::operator=((Am_Value_List *)local_48,(Am_Value_List *)&part_chain.item);
  Am_Value_List::~Am_Value_List((Am_Value_List *)&part_chain.item);
  Am_Value_List::Am_Value_List((Am_Value_List *)&proto);
  Am_Object::Am_Object(&script_line);
  pAVar3 = Am_Value_List::Get_First((Am_Value_List *)local_48);
  Am_Object::Am_Object(&create_cmd,pAVar3);
  pAVar3 = Am_Object::Get(&create_cmd,0xc5,0);
  Am_Object::Am_Object((Am_Object *)&stack0xffffffffffffff50,pAVar3);
  Am_Object::Am_Object(&local_b8,&Am_Object_Create_Command);
  bVar1 = Am_Object::Is_Instance_Of((Am_Object *)&stack0xffffffffffffff50,&local_b8);
  local_40a = 0;
  if (!bVar1) {
    Am_Object::Am_Object(&local_c0,&Am_Find_Command);
    bVar1 = Am_Object::Is_Instance_Of((Am_Object *)&stack0xffffffffffffff50,&local_c0);
    local_40a = bVar1 ^ 0xff;
    Am_Object::~Am_Object(&local_c0);
  }
  Am_Object::~Am_Object(&local_b8);
  if ((local_40a & 1) != 0) {
    Am_Object::operator=((Am_Object *)&stack0xffffffffffffff50,&Am_No_Object);
  }
  pAVar3 = Am_Object::Get(&local_18,0x169,0);
  Am_Value::Am_Value((Am_Value *)&placeholder_list.item,pAVar3);
  pAVar3 = Am_Object::Get((Am_Object *)&stack0xffffffffffffffa8,Am_PLACEHOLDER_LIST,0);
  Am_Value_List::Am_Value_List((Am_Value_List *)local_e8,pAVar3);
  pAVar3 = Am_Object::Get((Am_Object *)&stack0xffffffffffffffa8,Am_PLACEHOLDER_COUNT,0);
  local_ec = Am_Value::operator_cast_to_int(pAVar3);
  if (local_5c == 1) {
    Am_Object::Get_Object(&local_f8,(Am_Slot_Key)&local_18,(ulong)Am_CONSTANT_OBJECTS_WIDGET);
    pAVar3 = Am_Object::Get(&local_f8,0xfa,0);
    Am_Value::operator=((Am_Value *)&placeholder_list.item,pAVar3);
    Am_Object::~Am_Object(&local_f8);
    Am_Object::operator=(&script_line,&Am_Constant_Placeholder);
  }
  else if (local_5c == 4) {
    Am_Object::Get_Object
              ((Am_Object *)(line + 0xf8),(Am_Slot_Key)&local_18,(ulong)Am_ALL_FROM_COMMAND_WIDGET);
    pAVar3 = Am_Object::Get((Am_Object *)(line + 0xf8),0xfa,3);
    Am_Object::operator=((Am_Object *)&stack0xffffffffffffff50,pAVar3);
    Am_Object::~Am_Object((Am_Object *)(line + 0xf8));
    bVar1 = Am_Object::Valid((Am_Object *)&stack0xffffffffffffff50);
    if (!bVar1) {
      std::ostrstream::ostrstream(local_370,local_208,0xfa,_S_out);
      poVar4 = std::operator<<((ostream *)local_370,"Command not filled in.");
      std::ostream::operator<<(poVar4,std::ends<char,std::char_traits<char>>);
      Am_Pop_Up_Error_Window(local_208);
      std::ostrstream::~ostrstream(local_370);
      new_ph.data._4_4_ = 1;
      goto LAB_002abbee;
    }
    Am_Object::operator=(&script_line,&Am_All_Values_From_Command_Placeholder);
  }
  else {
    if (local_5c == 6) {
      Am_Error("Custom not yet implemented");
    }
    if (local_5c == 0x18) {
      pAVar3 = Am_Object::Get(&local_18,Am_REGISTRY_FOR_PALETTES,0);
      Am_Value_List::Add((Am_Value_List *)&proto,pAVar3,Am_TAIL,true);
      Am_Object::operator=(&script_line,&Am_Property_From_Palette_Placeholder);
    }
    else if (local_5c == 0x19) {
      Am_Object::Get_Object
                (&local_100,(Am_Slot_Key)&local_18,(ulong)Am_NEXT_CONSTANT_OBJECTS_WIDGET);
      pAVar3 = Am_Object::Get(&local_100,0xfa,0);
      Am_Value::operator=((Am_Value *)&placeholder_list.item,pAVar3);
      Am_Object::~Am_Object(&local_100);
      Am_Object::operator=(&script_line,&Am_Cycle_Values_Placeholder);
    }
    else {
      if (local_5c != 0x65) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
        poVar4 = std::operator<<(poVar4,"Bad type ");
        pvVar5 = (void *)std::ostream::operator<<(poVar4,local_5c);
        std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
        Am_Error();
      }
      Am_Object::operator=(&script_line,&Am_Ask_User_Property_Placeholder);
    }
  }
  Am_Object::Am_Object((Am_Object *)&new_value.value,&script_line);
  am_call_create_placeholder
            (&local_380,(Am_Value *)&new_value.value,(Am_Object *)&placeholder_list.item,
             (Am_Value_List *)&stack0xffffffffffffff50,(Am_Value_List *)local_e8,(int *)&proto,
             (Am_Slot_Key)&local_ec);
  Am_Object::~Am_Object((Am_Object *)&new_value.value);
  if ((am_sdebug & 1U) != 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"ValGen: New placeholder is ");
    poVar4 = operator<<(poVar4,&local_380);
    pvVar5 = (void *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(pvVar5,std::flush<char,std::char_traits<char>>);
  }
  key = Am_PLACEHOLDER_LIST;
  pAVar6 = Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)local_e8);
  Am_Object::Set((Am_Object *)&stack0xffffffffffffffa8,key,pAVar6,0);
  Am_Object::Set((Am_Object *)&stack0xffffffffffffffa8,Am_PLACEHOLDER_COUNT,local_ec,0);
  Am_Value::Am_Value((Am_Value *)local_398);
  pAVar6 = Am_Object::operator_cast_to_Am_Wrapper_(&local_380);
  Am_Value::operator=((Am_Value *)local_398,pAVar6);
  am_script_replace_all
            ((Am_Value_List *)local_48,(Am_Value *)local_398,(Am_Object *)&sel_list.item,
             execute_command.data._6_2_,(Am_Object *)&stack0xffffffffffffffa8);
  Am_Object::Am_Object(&local_3a0,&local_18);
  done_with_valgen_window(&local_3a0);
  Am_Object::~Am_Object(&local_3a0);
  Am_Value::~Am_Value((Am_Value *)local_398);
  Am_Object::~Am_Object(&local_380);
  new_ph.data._4_4_ = 0;
LAB_002abbee:
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_e8);
  Am_Value::~Am_Value((Am_Value *)&placeholder_list.item);
  Am_Object::~Am_Object((Am_Object *)&stack0xffffffffffffff50);
  Am_Object::~Am_Object(&create_cmd);
  Am_Object::~Am_Object(&script_line);
  Am_Value_List::~Am_Value_List((Am_Value_List *)&proto);
  Am_Object::~Am_Object((Am_Object *)&stack0xffffffffffffffa8);
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_48);
  Am_Object::~Am_Object((Am_Object *)&sel_list.item);
  Am_Object::~Am_Object(&local_18);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, am_valgen_ok, (Am_Object cmd))
{
  Am_Object valgen_window = cmd.Get_Object(Am_SAVED_OLD_OWNER).Get_Owner();
  Am_Object script_window = valgen_window.Get(Am_SCRIPT_WINDOW);
  Am_Value_List sel_list = valgen_window.Get(Am_COMMAND);
  Am_Slot_Key slot = (Am_Slot_Key)(int)valgen_window.Get(Am_SLOTS_TO_SAVE);
  Am_Object execute_command = script_window.Get(Am_SCRIPT_EXECUTE_COMMAND);
  int how_gen = valgen_window.Get_Object(Am_UNDO_OPTIONS).Get(Am_VALUE);
  bool modify_first_only =
      (int)(valgen_window.Get_Object(Am_GREEN_AND_YELLOW).Get(Am_VALUE)) ==
      am_generalize_only_green;
  sel_list =
      sort_sel_list_cmd_order(sel_list, execute_command, modify_first_only);
  Am_Value_List part_chain;
  Am_Object proto;
  Am_Object script_line = sel_list.Get_First();
  Am_Object create_cmd = script_line.Get(Am_COMMAND);
  if (!create_cmd.Is_Instance_Of(Am_Object_Create_Command) &&
      !create_cmd.Is_Instance_Of(Am_Find_Command))
    create_cmd = Am_No_Object;
  Am_Value old_val = valgen_window.Get(Am_VALUE);

  Am_Value_List placeholder_list = execute_command.Get(Am_PLACEHOLDER_LIST);
  int placeholder_cnt = execute_command.Get(Am_PLACEHOLDER_COUNT);
  switch (how_gen) {
  case am_constant_generalize:
    old_val =
        valgen_window.Get_Object(Am_CONSTANT_OBJECTS_WIDGET).Get(Am_VALUES);
    proto = Am_Constant_Placeholder;
    break;
  case am_palette_generalize:
    part_chain.Add(valgen_window.Get(Am_REGISTRY_FOR_PALETTES)); //hack
    proto = Am_Property_From_Palette_Placeholder;
    break;
  case am_next_value_generalize:
    old_val = valgen_window.Get_Object(Am_NEXT_CONSTANT_OBJECTS_WIDGET)
                  .Get(Am_VALUES);
    proto = Am_Cycle_Values_Placeholder;
    break;
  case am_ask_user_generalize:
    proto = Am_Ask_User_Property_Placeholder;
    break;
  case am_all_values_generalize:
    create_cmd = valgen_window.Get_Object(Am_ALL_FROM_COMMAND_WIDGET)
                     .Get(Am_VALUES, Am_RETURN_ZERO_ON_ERROR);
    if (!create_cmd.Valid()) {
      AM_POP_UP_ERROR_WINDOW("Command not filled in.");
      return; //don't finish with this window
    }
    proto = Am_All_Values_From_Command_Placeholder;
    break;
  case am_custom_generalize: {
    Am_Error("Custom not yet implemented");
    break;
  }
  default:
    Am_ERROR("Bad type " << how_gen);
  } //end switch

  Am_Object new_ph =
      am_call_create_placeholder(proto, old_val, create_cmd, placeholder_list,
                                 part_chain, placeholder_cnt, slot);
  if (am_sdebug)
    std::cout << "ValGen: New placeholder is " << new_ph << std::endl
              << std::flush;
  execute_command.Set(Am_PLACEHOLDER_LIST, placeholder_list);
  execute_command.Set(Am_PLACEHOLDER_COUNT, placeholder_cnt);
  Am_Value new_value;
  new_value = new_ph;
  am_script_replace_all(sel_list, new_value, script_window, slot,
                        execute_command);
  done_with_valgen_window(valgen_window);
}